

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpackingaligned.cpp
# Opt level: O3

uint32_t * FastPForLib::__fastpackwithoutmask31_32(uint32_t *in,uint32_t *out)

{
  uint32_t uVar1;
  ulong uVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  undefined1 auVar7 [64];
  undefined1 auVar8 [64];
  undefined1 auVar9 [64];
  undefined1 auVar10 [64];
  undefined1 auVar11 [64];
  undefined1 auVar12 [16];
  
  auVar7 = vpmovsxbd_avx512f(_DAT_00191d90);
  auVar3 = vpshufd_avx(*(undefined1 (*) [16])(in + 0xd),0xe9);
  auVar8 = vmovdqu64_avx512f(*(undefined1 (*) [64])(in + 1));
  auVar6 = *(undefined1 (*) [32])(in + 9);
  auVar5 = vpsrlvd_avx2(*(undefined1 (*) [32])(in + 1),_DAT_0019a060);
  auVar4 = vpsrlvd_avx2(*(undefined1 (*) [16])(in + 9),_DAT_0019d320);
  auVar3 = vpsrlvd_avx2(auVar3,_DAT_0019d330);
  auVar8 = vpsllvd_avx512f(auVar8,_DAT_001aecc0);
  uVar1 = in[0x1f];
  auVar7 = vpermi2d_avx512f(auVar7,ZEXT3264(auVar5),ZEXT464(*in));
  auVar9 = vpmovsxbd_avx512f(_DAT_00191da0);
  auVar10 = vpmovsxbq_avx512f(ZEXT816(0x806050403020100));
  auVar7 = vpermi2d_avx512f(auVar9,auVar7,ZEXT1664(auVar4));
  auVar9 = vpbroadcastd_avx512f();
  auVar11._0_52_ = auVar7._0_52_;
  auVar11._52_4_ = auVar9._52_4_;
  auVar11._56_4_ = auVar7._56_4_;
  auVar11._60_4_ = auVar7._60_4_;
  uVar2 = *(ulong *)(in + 0x1d);
  auVar7 = vpermi2q_avx512f(auVar10,auVar11,ZEXT1664(auVar3));
  auVar7 = vpord_avx512f(auVar8,auVar7);
  auVar7 = vmovdqu64_avx512f(auVar7);
  *(undefined1 (*) [64])out = auVar7;
  auVar6 = valignd_avx512vl(*(undefined1 (*) [32])(in + 0x11),auVar6,7);
  auVar5 = vpsrlvd_avx2(auVar6,_DAT_0019a080);
  auVar6 = vpsllvd_avx2(*(undefined1 (*) [32])(in + 0x11),_DAT_00191aa0);
  auVar6 = vpor_avx2(auVar6,auVar5);
  auVar3 = *(undefined1 (*) [16])(in + 0x15);
  *(undefined1 (*) [32])(out + 0x10) = auVar6;
  auVar4 = *(undefined1 (*) [16])(in + 0x19);
  auVar12 = vpsllvd_avx2(auVar4,_DAT_00191d40);
  auVar3 = vpalignr_avx(auVar4,auVar3,0xc);
  auVar3 = vpsrlvd_avx2(auVar3,_DAT_0019d340);
  auVar3 = vpor_avx(auVar12,auVar3);
  *(undefined1 (*) [16])(out + 0x18) = auVar3;
  auVar12._8_8_ = 0;
  auVar12._0_8_ = uVar2;
  auVar3 = vpalignr_avx(auVar12,auVar4,0xc);
  auVar4 = vpsrlvd_avx2(auVar3,_DAT_0019feb0);
  auVar3 = vpsllvd_avx2(auVar12,_DAT_0019de30);
  auVar3 = vpor_avx(auVar3,auVar4);
  *(long *)(out + 0x1c) = auVar3._0_8_;
  out[0x1e] = uVar1 * 2 | (uint)(uVar2 >> 0x3e);
  return out + 0x1f;
}

Assistant:

uint32_t *__fastpackwithoutmask31_32(const uint32_t *__restrict__ in,
                                     uint32_t *__restrict__ out) {

  *out = (*in);
  ++in;
  *out |= ((*in)) << 31;
  ++out;
  *out = ((*in)) >> (31 - 30);
  ++in;
  *out |= ((*in)) << 30;
  ++out;
  *out = ((*in)) >> (31 - 29);
  ++in;
  *out |= ((*in)) << 29;
  ++out;
  *out = ((*in)) >> (31 - 28);
  ++in;
  *out |= ((*in)) << 28;
  ++out;
  *out = ((*in)) >> (31 - 27);
  ++in;
  *out |= ((*in)) << 27;
  ++out;
  *out = ((*in)) >> (31 - 26);
  ++in;
  *out |= ((*in)) << 26;
  ++out;
  *out = ((*in)) >> (31 - 25);
  ++in;
  *out |= ((*in)) << 25;
  ++out;
  *out = ((*in)) >> (31 - 24);
  ++in;
  *out |= ((*in)) << 24;
  ++out;
  *out = ((*in)) >> (31 - 23);
  ++in;
  *out |= ((*in)) << 23;
  ++out;
  *out = ((*in)) >> (31 - 22);
  ++in;
  *out |= ((*in)) << 22;
  ++out;
  *out = ((*in)) >> (31 - 21);
  ++in;
  *out |= ((*in)) << 21;
  ++out;
  *out = ((*in)) >> (31 - 20);
  ++in;
  *out |= ((*in)) << 20;
  ++out;
  *out = ((*in)) >> (31 - 19);
  ++in;
  *out |= ((*in)) << 19;
  ++out;
  *out = ((*in)) >> (31 - 18);
  ++in;
  *out |= ((*in)) << 18;
  ++out;
  *out = ((*in)) >> (31 - 17);
  ++in;
  *out |= ((*in)) << 17;
  ++out;
  *out = ((*in)) >> (31 - 16);
  ++in;
  *out |= ((*in)) << 16;
  ++out;
  *out = ((*in)) >> (31 - 15);
  ++in;
  *out |= ((*in)) << 15;
  ++out;
  *out = ((*in)) >> (31 - 14);
  ++in;
  *out |= ((*in)) << 14;
  ++out;
  *out = ((*in)) >> (31 - 13);
  ++in;
  *out |= ((*in)) << 13;
  ++out;
  *out = ((*in)) >> (31 - 12);
  ++in;
  *out |= ((*in)) << 12;
  ++out;
  *out = ((*in)) >> (31 - 11);
  ++in;
  *out |= ((*in)) << 11;
  ++out;
  *out = ((*in)) >> (31 - 10);
  ++in;
  *out |= ((*in)) << 10;
  ++out;
  *out = ((*in)) >> (31 - 9);
  ++in;
  *out |= ((*in)) << 9;
  ++out;
  *out = ((*in)) >> (31 - 8);
  ++in;
  *out |= ((*in)) << 8;
  ++out;
  *out = ((*in)) >> (31 - 7);
  ++in;
  *out |= ((*in)) << 7;
  ++out;
  *out = ((*in)) >> (31 - 6);
  ++in;
  *out |= ((*in)) << 6;
  ++out;
  *out = ((*in)) >> (31 - 5);
  ++in;
  *out |= ((*in)) << 5;
  ++out;
  *out = ((*in)) >> (31 - 4);
  ++in;
  *out |= ((*in)) << 4;
  ++out;
  *out = ((*in)) >> (31 - 3);
  ++in;
  *out |= ((*in)) << 3;
  ++out;
  *out = ((*in)) >> (31 - 2);
  ++in;
  *out |= ((*in)) << 2;
  ++out;
  *out = ((*in)) >> (31 - 1);
  ++in;
  *out |= ((*in)) << 1;
  ++out;
  ++in;

  return out;
}